

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O3

char * google::protobuf::internal::UTF8CoerceToStructurallyValid
                 (StringPiece *src_str,char *idst,char replace_char)

{
  char *__src;
  stringpiece_ssize_type sVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  int iVar9;
  uint local_34;
  
  __src = src_str->ptr_;
  sVar1 = src_str->length_;
  iVar3 = UTF8SpnStructurallyValid(src_str);
  iVar9 = (int)sVar1;
  pcVar6 = __src;
  if (iVar3 != iVar9) {
    sVar7 = (size_t)iVar3;
    memmove(idst,__src,sVar7);
    bVar2 = (anonymous_namespace)::module_initialized_;
    pcVar6 = idst;
    if ((long)sVar7 < (long)iVar9) {
      pcVar5 = __src + sVar7;
      pcVar8 = idst + sVar7;
      do {
        *pcVar8 = replace_char;
        pcVar5 = pcVar5 + 1;
        uVar4 = (long)(__src + iVar9) - (long)pcVar5;
        if ((long)uVar4 < 0) {
          __assert_fail("len >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/stringpiece.h"
                        ,0xe6,
                        "google::protobuf::StringPiece::StringPiece(const char *, stringpiece_ssize_type)"
                       );
        }
        if ((bVar2 & 1) != 0) {
          local_34 = 0;
          UTF8GenericScanFastAscii
                    ((UTF8ScanObj *)utf8acceptnonsurrogates_obj,pcVar5,(int)uVar4,(int *)&local_34);
          uVar4 = (ulong)local_34;
        }
        sVar7 = (size_t)(int)uVar4;
        memmove(pcVar8 + 1,pcVar5,sVar7);
        pcVar5 = pcVar5 + sVar7;
        pcVar8 = pcVar8 + 1 + sVar7;
      } while (pcVar5 < __src + iVar9);
    }
  }
  return pcVar6;
}

Assistant:

char* UTF8CoerceToStructurallyValid(const StringPiece& src_str,
                                    char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}